

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O0

void testWav(string *param_1)

{
  ostream *poVar1;
  int unaff_retaddr;
  int unaff_retaddr_00;
  exception *e;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing Wavelet encoder");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_254993::test(unaff_retaddr_00,unaff_retaddr);
  anon_unknown.dwarf_254993::test(unaff_retaddr_00,unaff_retaddr);
  anon_unknown.dwarf_254993::test(unaff_retaddr_00,unaff_retaddr);
  anon_unknown.dwarf_254993::test(unaff_retaddr_00,unaff_retaddr);
  anon_unknown.dwarf_254993::test(unaff_retaddr_00,unaff_retaddr);
  anon_unknown.dwarf_254993::test(unaff_retaddr_00,unaff_retaddr);
  anon_unknown.dwarf_254993::test(unaff_retaddr_00,unaff_retaddr);
  anon_unknown.dwarf_254993::test(unaff_retaddr_00,unaff_retaddr);
  anon_unknown.dwarf_254993::test(unaff_retaddr_00,unaff_retaddr);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testWav (const std::string&)
{
    try
    {
        cout << "Testing Wavelet encoder" << endl;

        test (1, 1);
        test (2, 2);
        test (32, 32);
        test (1024, 16);
        test (16, 1024);
        test (997, 37);
        test (37, 997);
        test (1024, 1024);
        test (997, 997);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}